

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O3

bool __thiscall
GeneratedSaxParser::ParserTemplateBase::handleError
          (ParserTemplateBase *this,Severity severity,ErrorType errorType,StringHash elementHash,
          ParserChar *attribute,ParserChar *additionalText)

{
  IErrorHandler *pIVar1;
  int iVar2;
  char *elementName;
  size_t lineNumber;
  size_t columnNumber;
  size_t sVar3;
  byte bVar4;
  char *__s;
  String local_a8;
  StringHash elementHash_local;
  ParserError error;
  
  pIVar1 = (this->super_Parser).mErrorHandler;
  if (pIVar1 == (IErrorHandler *)0x0) {
    bVar4 = severity == SEVERITY_CRITICAL;
  }
  else {
    elementHash_local = elementHash;
    elementName = getNameByStringHash(this,&elementHash_local);
    lineNumber = Parser::getLineNumber(&this->super_Parser);
    columnNumber = Parser::getColumnNumber(&this->super_Parser);
    __s = "";
    if (additionalText != (ParserChar *)0x0) {
      __s = additionalText;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,__s,__s + sVar3);
    ParserError::ParserError
              (&error,severity,errorType,elementName,attribute,lineNumber,columnNumber,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    iVar2 = (*pIVar1->_vptr_IErrorHandler[2])(pIVar1,&error);
    bVar4 = severity == SEVERITY_CRITICAL | (byte)iVar2;
    ParserError::~ParserError(&error);
  }
  return (bool)bVar4;
}

Assistant:

bool ParserTemplateBase::handleError( ParserError::Severity severity,
        ParserError::ErrorType errorType,
        StringHash elementHash,
        const ParserChar* attribute,
        const ParserChar* additionalText /*= ""*/ )
    {
        IErrorHandler* errorHandler = getErrorHandler();
        if ( !errorHandler )
            return (severity == ParserError::SEVERITY_CRITICAL) ? true : false;

        ParserError error(severity,
            errorType,
            getNameByStringHash(elementHash),
            attribute,
            getLineNumber(),
            getColumnNumber(),
            additionalText ? (const char*)additionalText : "");
        bool handlerWantsToAbort = errorHandler->handleError(error);

        return (severity == ParserError::SEVERITY_CRITICAL) ? true : handlerWantsToAbort;
    }